

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::status_internal::Status::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Status *this)

{
  StatusCode SVar1;
  StatusCode in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  SVar1 = this->error_code_;
  if (SVar1 == kOk) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"OK",(allocator *)&bStack_58);
  }
  else if ((this->error_message_)._M_string_length == 0) {
    (anonymous_namespace)::StatusCodeToString_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)SVar1,in_EDX);
  }
  else {
    (anonymous_namespace)::StatusCodeToString_abi_cxx11_
              (&local_38,(_anonymous_namespace_ *)(ulong)SVar1,in_EDX);
    std::operator+(&bStack_58,&local_38,":");
    std::operator+(__return_storage_ptr__,&bStack_58,&this->error_message_);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToString() const {
  if (error_code_ == StatusCode::kOk) {
    return "OK";
  } else {
    if (error_message_.empty()) {
      return StatusCodeToString(error_code_);
    } else {
      return StatusCodeToString(error_code_) + ":" + error_message_;
    }
  }
}